

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesRasGetProperties(zes_ras_handle_t hRas,zes_ras_properties_t *pProperties)

{
  zes_pfnRasGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_ras_properties_t *pProperties_local;
  zes_ras_handle_t hRas_local;
  
  if (*(code **)(*(long *)(hRas + 8) + 0xc98) == (code *)0x0) {
    hRas_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hRas_local._4_4_ = (**(code **)(*(long *)(hRas + 8) + 0xc98))(*(undefined8 *)hRas,pProperties);
  }
  return hRas_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetProperties(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_properties_t* pProperties               ///< [in,out] Structure describing RAS properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_ras_object_t*>( hRas )->dditable;
        auto pfnGetProperties = dditable->zes.Ras.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hRas = reinterpret_cast<zes_ras_object_t*>( hRas )->handle;

        // forward to device-driver
        result = pfnGetProperties( hRas, pProperties );

        return result;
    }